

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

void __thiscall mp::QP2Passes::Process(QP2Passes *this,Expr expr)

{
  bool bVar1;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  BVar2;
  QP2Passes *in_RSI;
  ExprBase in_RDI;
  QP2Passes *in_stack_00000010;
  QP2Passes *in_stack_00000030;
  QP2Passes *in_stack_000071d0;
  
  BVar2 = Cast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                    ((Expr)in_RDI.impl_);
  *(BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45> *)&in_RDI.impl_[4].kind_ =
       BVar2.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_;
  RunPass1(in_stack_00000030);
  bVar1 = Pass2SeemsWorth(in_stack_00000010);
  if (bVar1) {
    RunPass2Full(in_RSI);
  }
  else {
    RunPass2Buckets(in_stack_000071d0);
  }
  return;
}

Assistant:

void QP2Passes::Process(Expr expr) {
  assert(expr::Kind::SUM == expr.kind());             //for now
  top_expr_ = Cast<internal::ExprTypes::SumExpr>(expr);
  RunPass1();
  if (Pass2SeemsWorth())
    RunPass2Full();
  else
    RunPass2Buckets();
}